

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O2

void anon_unknown.dwarf_1b0988::releasePixels
               (int type,Array2D<unsigned_int_*> *uintData,Array2D<float_*> *floatData,
               Array2D<Imath_3_2::half_*> *halfData,int x1,int x2,int y1,int y2)

{
  half **pphVar1;
  Array2D<Imath_3_2::half_*> *pAVar2;
  int x;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)y1;
  lVar4 = lVar5 * 8;
  do {
    lVar3 = (long)x1;
    if (y2 < lVar5) {
      return;
    }
    for (; lVar3 <= x2; lVar3 = lVar3 + 1) {
      pAVar2 = halfData;
      if ((type == 2) || (pAVar2 = (Array2D<Imath_3_2::half_*> *)floatData, type == 1)) {
        pphVar1 = (half **)(pAVar2->_sizeY * lVar4 + (long)pAVar2->_data);
LAB_0016ed71:
        if (pphVar1[lVar3] != (half *)0x0) {
          operator_delete__(pphVar1[lVar3]);
        }
      }
      else if (type == 0) {
        pphVar1 = (half **)(uintData->_sizeY * lVar4 + (long)uintData->_data);
        goto LAB_0016ed71;
      }
    }
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 8;
  } while( true );
}

Assistant:

void
releasePixels (
    int                     type,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     x1,
    int                     x2,
    int                     y1,
    int                     y2)
{
    for (int y = y1; y <= y2; y++)
        for (int x = x1; x <= x2; x++)
        {
            if (type == 0) delete[] uintData[y][x];
            if (type == 1) delete[] floatData[y][x];
            if (type == 2) delete[] halfData[y][x];
        }
}